

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

DPSprite * __thiscall player_t::GetPSprite(player_t *this,PSPLayers layer)

{
  size_t len;
  DPSprite *local_30;
  DPSprite *pspr;
  AActor *newcaller;
  AActor *oldcaller;
  PSPLayers layer_local;
  player_t *this_local;
  
  newcaller = (AActor *)0x0;
  pspr = (DPSprite *)0x0;
  if (layer < PSP_TARGETCENTER) {
    if (layer == PSP_STRIFEHANDS) {
      pspr = (DPSprite *)this->mo;
    }
    else {
      pspr = (DPSprite *)this->ReadyWeapon;
    }
  }
  else if (this->mo != (APlayerPawn *)0x0) {
    pspr = (DPSprite *)
           AActor::FindInventory
                     (&this->mo->super_AActor,
                      (PClassActor *)APowerTargeter::RegistrationInfo.MyClass,true);
  }
  if (pspr == (DPSprite *)0x0) {
    __assert_fail("newcaller != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0xce,"DPSprite *player_t::GetPSprite(PSPLayers)");
  }
  len = (size_t)(uint)layer;
  local_30 = FindPSprite(this,layer);
  if (local_30 == (DPSprite *)0x0) {
    local_30 = (DPSprite *)DObject::operator_new((DObject *)0x88,len);
    DPSprite::DPSprite(local_30,this,(AActor *)pspr,layer);
  }
  else {
    newcaller = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_30->Caller);
  }
  TObjPtr<AActor>::operator=(&local_30->Caller,(AActor *)pspr);
  if ((AActor *)pspr != newcaller) {
    if (layer < PSP_TARGETCENTER) {
      local_30->Flags = 0xf;
    }
    else {
      local_30->Flags = 0xc;
    }
    if (layer == PSP_STRIFEHANDS) {
      local_30->State = (FState *)0x0;
      local_30->y = 32.375;
    }
    local_30->firstTic = true;
  }
  return local_30;
}

Assistant:

DPSprite *player_t::GetPSprite(PSPLayers layer)
{
	AActor *oldcaller = nullptr;
	AActor *newcaller = nullptr;

	if (layer >= PSP_TARGETCENTER)
	{
		if (mo != nullptr)
		{
			newcaller = mo->FindInventory(RUNTIME_CLASS(APowerTargeter), true);
		}
	}
	else if (layer == PSP_STRIFEHANDS)
	{
		newcaller = mo;
	}
	else
	{
		newcaller = ReadyWeapon;
	}

	assert(newcaller != nullptr);

	DPSprite *pspr = FindPSprite(layer);
	if (pspr == nullptr)
	{
		pspr = new DPSprite(this, newcaller, layer);
	}
	else
	{
		oldcaller = pspr->Caller;
	}

	// Always update the caller here in case we switched weapon
	// or if the layer was being used by something else before.
	pspr->Caller = newcaller;

	if (newcaller != oldcaller)
	{ // Only reset stuff if this layer was created now or if it was being used before.
		if (layer >= PSP_TARGETCENTER)
		{ // The targeter layers were affected by those.
			pspr->Flags = (PSPF_CVARFAST|PSPF_POWDOUBLE);
		}
		else
		{
			pspr->Flags = (PSPF_ADDWEAPON|PSPF_ADDBOB|PSPF_CVARFAST|PSPF_POWDOUBLE);
		}
		if (layer == PSP_STRIFEHANDS)
		{
			// Some of the old hacks rely on this layer coming from the FireHands state.
			// This is the ONLY time a psprite's state is actually null.
			pspr->State = nullptr;
			pspr->y = WEAPONTOP;
		}

		pspr->firstTic = true;
	}

	return pspr;
}